

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield_cpu.cpp
# Opt level: O1

void __thiscall MeanField::CPU::CRF::filterGaussian(CRF *this,float *unaries)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int x;
  float fVar15;
  long local_68;
  
  if (this->separable == false) {
    if (0 < this->height) {
      iVar5 = 0;
      do {
        iVar13 = this->width;
        if (0 < iVar13) {
          x = 0;
          do {
            Filtering::applyGaussianKernel
                      ((this->spatialKernel)._M_t.
                       super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                       super__Head_base<0UL,_float_*,_false>._M_head_impl,unaries,
                       (this->gaussianOut)._M_t.
                       super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                       super__Head_base<0UL,_float_*,_false>._M_head_impl,this->spatialSD,
                       this->dimensions,x,iVar5,iVar13,this->height);
            x = x + 1;
            iVar13 = this->width;
          } while (x < iVar13);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->height);
    }
  }
  else {
    if (0 < this->height) {
      iVar5 = 0;
      do {
        uVar12 = (ulong)(uint)this->width;
        if (0 < this->width) {
          lVar8 = 0;
          do {
            pfVar11 = (this->filterOutTmp)._M_t.
                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl;
            pfVar3 = (this->spatialKernel)._M_t.
                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl;
            fVar15 = this->spatialSD;
            uVar2 = this->dimensions;
            lVar14 = (long)(int)uVar2;
            uVar9 = lVar14 * 4;
            if (lVar14 < 0) {
              uVar9 = 0xffffffffffffffff;
            }
            pvVar6 = operator_new__(uVar9);
            uVar9 = (ulong)uVar2;
            if (0 < lVar14) {
              memset(pvVar6,0,uVar9 * 4);
            }
            uVar4 = (uint)fVar15;
            iVar13 = (int)uVar12;
            if ((int)uVar4 < 0) {
              fVar15 = 0.0;
            }
            else {
              lVar7 = (long)(int)-uVar4;
              pfVar10 = unaries + ((iVar5 * iVar13 + lVar8) - (long)(int)uVar4) * lVar14;
              fVar15 = 0.0;
              do {
                if (lVar7 + lVar8 < (long)iVar13 && -1 < lVar7 + lVar8) {
                  fVar1 = pfVar3[(ulong)uVar4 - lVar7];
                  fVar15 = fVar15 + fVar1;
                  if (0 < (int)uVar2) {
                    uVar12 = 0;
                    do {
                      *(float *)((long)pvVar6 + uVar12 * 4) =
                           pfVar10[uVar12] * fVar1 + *(float *)((long)pvVar6 + uVar12 * 4);
                      uVar12 = uVar12 + 1;
                    } while (uVar9 != uVar12);
                  }
                }
                lVar7 = lVar7 + 1;
                pfVar10 = pfVar10 + lVar14;
              } while (uVar4 + 1 != (int)lVar7);
            }
            if ((0 < (int)uVar2) && (0.0 < fVar15)) {
              uVar12 = 0;
              do {
                pfVar11[(long)(int)((iVar13 * iVar5 + (int)lVar8) * uVar2) + uVar12] =
                     *(float *)((long)pvVar6 + uVar12 * 4) / fVar15;
                uVar12 = uVar12 + 1;
              } while (uVar9 != uVar12);
            }
            operator_delete__(pvVar6);
            lVar8 = lVar8 + 1;
            uVar12 = (ulong)this->width;
          } while (lVar8 < (long)uVar12);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->height);
    }
    if (0 < this->height) {
      lVar8 = 0;
      do {
        uVar12 = (ulong)(uint)this->width;
        if (0 < this->width) {
          local_68 = 0;
          do {
            pfVar11 = (this->filterOutTmp)._M_t.
                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl;
            pfVar3 = (this->gaussianOut)._M_t.
                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl;
            pfVar10 = (this->spatialKernel)._M_t.
                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl;
            fVar15 = this->spatialSD;
            uVar2 = this->dimensions;
            lVar14 = (long)(int)uVar2;
            uVar9 = lVar14 * 4;
            iVar5 = this->height;
            if (lVar14 < 0) {
              uVar9 = 0xffffffffffffffff;
            }
            pvVar6 = operator_new__(uVar9);
            uVar9 = (ulong)uVar2;
            if (0 < lVar14) {
              memset(pvVar6,0,uVar9 * 4);
            }
            uVar4 = (uint)fVar15;
            iVar13 = (int)uVar12;
            if ((int)uVar4 < 0) {
              fVar15 = 0.0;
            }
            else {
              lVar7 = (long)(int)-uVar4;
              pfVar11 = pfVar11 + ((lVar8 - (int)uVar4) * (long)iVar13 + local_68) * lVar14;
              fVar15 = 0.0;
              do {
                if ((-1 < lVar7 + lVar8) && (lVar7 + lVar8 < (long)iVar5)) {
                  fVar1 = pfVar10[(ulong)uVar4 - lVar7];
                  fVar15 = fVar15 + fVar1;
                  if (0 < (int)uVar2) {
                    uVar12 = 0;
                    do {
                      *(float *)((long)pvVar6 + uVar12 * 4) =
                           pfVar11[uVar12] * fVar1 + *(float *)((long)pvVar6 + uVar12 * 4);
                      uVar12 = uVar12 + 1;
                    } while (uVar9 != uVar12);
                  }
                }
                lVar7 = lVar7 + 1;
                pfVar11 = pfVar11 + iVar13 * lVar14;
              } while (uVar4 + 1 != (int)lVar7);
            }
            if ((0 < (int)uVar2) && (0.0 < fVar15)) {
              uVar12 = 0;
              do {
                pfVar3[(long)(int)((iVar13 * (int)lVar8 + (int)local_68) * uVar2) + uVar12] =
                     *(float *)((long)pvVar6 + uVar12 * 4) / fVar15;
                uVar12 = uVar12 + 1;
              } while (uVar9 != uVar12);
            }
            operator_delete__(pvVar6);
            local_68 = local_68 + 1;
            uVar12 = (ulong)this->width;
          } while (local_68 < (long)uVar12);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->height);
    }
  }
  return;
}

Assistant:

void CRF::filterGaussian(const float *unaries) {
    if (!separable) {
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernel(spatialKernel.get(), unaries, gaussianOut.get(), spatialSD, dimensions, j, i, width, height);
            }
        }
    }
    else {
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernelX(unaries, filterOutTmp.get(), spatialKernel.get(), spatialSD,
                    dimensions, j, i, width, height);
            }
        }

        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernelY(filterOutTmp.get(), gaussianOut.get(), spatialKernel.get(), spatialSD,
                    dimensions, j, i, width, height);
            }
        }
    }
}